

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_Exercises.cpp
# Opt level: O1

void Question_4(void)

{
  _Rb_tree_header *p_Var1;
  _Self __tmp;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *this;
  int iVar4;
  _Rb_tree_color unaff_EBP;
  int n;
  int num;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  std::istream::operator>>((istream *)&std::cin,&local_68);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar4 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (0 < local_68) {
    unaff_EBP = _S_red;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_64);
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,&local_64);
      *pmVar2 = *pmVar2 + 1;
      unaff_EBP = unaff_EBP + _S_black;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while ((int)unaff_EBP < local_68);
  }
  do {
    if (iVar4 < *(int *)&p_Var3[1].field_0x4) {
      unaff_EBP = p_Var3[1]._M_color;
      iVar4 = *(int *)&p_Var3[1].field_0x4;
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,unaff_EBP);
  std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
  std::ostream::operator<<(this,iVar4);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Question_4()
{
    int n,num,ans1,ans2 = 0;
    cin >>n;
    map<int,int > m;
    for (int i = 0; i < n; ++i) {
        cin >> num;
        m[num]++;
    }
    for (map<int,int>::iterator it = m.begin(); it != m.end(); it ++)
    {
        if((it->second) > ans2)  //找到其中次数最多的
        {
            ans2 = it -> second;
            ans1 = it -> first;
        }
    }
    cout << ans1 << " " << ans2;
}